

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::MacroFormalArgumentListSyntax::MacroFormalArgumentListSyntax
          (MacroFormalArgumentListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *args,Token closeParen)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  MacroFormalArgumentSyntax *pMVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::MacroFormalArgumentSyntax_*> local_30;
  
  uVar5 = openParen._0_8_;
  uVar6 = closeParen._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = MacroFormalArgumentList;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  SVar2 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->args).super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->args).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->args).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->args).super_SyntaxListBase.childCount = (args->super_SyntaxListBase).childCount;
  (this->args).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0046fff0;
  sVar1 = (args->elements).size_;
  (this->args).elements.data_ = (args->elements).data_;
  (this->args).elements.size_ = sVar1;
  (this->closeParen).kind = (short)uVar6;
  (this->closeParen).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeParen).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeParen).info = closeParen.info;
  (this->args).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->args).elements.size_;
  local_30.list = &this->args;
  for (; (local_30.list != &this->args || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pMVar4 = SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::
             iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>::operator*(&local_30);
    (pMVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

MacroFormalArgumentListSyntax(Token openParen, const SeparatedSyntaxList<MacroFormalArgumentSyntax>& args, Token closeParen) :
        SyntaxNode(SyntaxKind::MacroFormalArgumentList), openParen(openParen), args(args), closeParen(closeParen) {
        this->args.parent = this;
        for (auto child : this->args)
            child->parent = this;
    }